

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_log.cc
# Opt level: O2

bool __thiscall BuildLog::Recompact(BuildLog *this,string *path,BuildLogUser *user,string *err)

{
  Metrics *this_00;
  bool bVar1;
  int iVar2;
  FILE *__stream;
  int *piVar3;
  Metric *pMVar4;
  __node_base *p_Var5;
  long lVar6;
  BuildLog *this_01;
  size_t i;
  ulong uVar7;
  string temp_path;
  vector<StringPiece,_std::allocator<StringPiece>_> dead_outputs;
  ScopedMetric metrics_h_scoped;
  
  if (Recompact(std::__cxx11::string_const&,BuildLogUser_const&,std::__cxx11::string*)::
      metrics_h_metric == '\0') {
    iVar2 = __cxa_guard_acquire(&Recompact(std::__cxx11::string_const&,BuildLogUser_const&,std::__cxx11::string*)
                                 ::metrics_h_metric);
    this_00 = g_metrics;
    if (iVar2 != 0) {
      if (g_metrics == (Metrics *)0x0) {
        pMVar4 = (Metric *)0x0;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&temp_path,".ninja_log recompact",(allocator<char> *)&dead_outputs);
        pMVar4 = Metrics::NewMetric(this_00,&temp_path);
        std::__cxx11::string::~string((string *)&temp_path);
      }
      Recompact::metrics_h_metric = pMVar4;
      __cxa_guard_release(&Recompact(std::__cxx11::string_const&,BuildLogUser_const&,std::__cxx11::string*)
                           ::metrics_h_metric);
    }
  }
  ScopedMetric::ScopedMetric(&metrics_h_scoped,Recompact::metrics_h_metric);
  Close(this);
  std::operator+(&temp_path,path,".recompact");
  __stream = fopen(temp_path._M_dataplus._M_p,"wb");
  if (__stream == (FILE *)0x0) {
    piVar3 = __errno_location();
    strerror(*piVar3);
    std::__cxx11::string::assign((char *)err);
  }
  else {
    iVar2 = fprintf(__stream,"# ninja log v%d\n",5);
    if (-1 < iVar2) {
      dead_outputs.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      dead_outputs.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      dead_outputs.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      p_Var5 = &(this->entries_)._M_h._M_before_begin;
LAB_001057ef:
      while (p_Var5 = p_Var5->_M_nxt, p_Var5 != (__node_base *)0x0) {
        this_01 = (BuildLog *)user;
        iVar2 = (**user->_vptr_BuildLogUser)
                          (user,p_Var5[1]._M_nxt,
                           *(_Hash_node_base **)
                            &((_Prime_rehash_policy *)(p_Var5 + 2))->_M_max_load_factor);
        if ((char)iVar2 == '\0') goto LAB_0010581a;
        std::vector<StringPiece,_std::allocator<StringPiece>_>::push_back
                  (&dead_outputs,(value_type *)(p_Var5 + 1));
      }
      lVar6 = 0;
      for (uVar7 = 0;
          uVar7 < (ulong)((long)dead_outputs.
                                super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)dead_outputs.
                                super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 4); uVar7 = uVar7 + 1) {
        std::
        _Hashtable<StringPiece,_std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_std::allocator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::_M_erase((_Hashtable<StringPiece,_std::pair<const_StringPiece,_BuildLog::LogEntry_*>,_std::allocator<std::pair<const_StringPiece,_BuildLog::LogEntry_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)this,(long)&(dead_outputs.
                                   super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->str_ + lVar6);
        lVar6 = lVar6 + 0x10;
      }
      fclose(__stream);
      iVar2 = unlink((path->_M_dataplus)._M_p);
      if (iVar2 < 0) {
LAB_001058c5:
        piVar3 = __errno_location();
        strerror(*piVar3);
        std::__cxx11::string::assign((char *)err);
        goto LAB_001058de;
      }
      iVar2 = rename(temp_path._M_dataplus._M_p,(path->_M_dataplus)._M_p);
      bVar1 = true;
      if (iVar2 < 0) goto LAB_001058c5;
      goto LAB_001058e0;
    }
    piVar3 = __errno_location();
    strerror(*piVar3);
    std::__cxx11::string::assign((char *)err);
    fclose(__stream);
  }
  bVar1 = false;
LAB_0010590f:
  std::__cxx11::string::~string((string *)&temp_path);
  ScopedMetric::~ScopedMetric(&metrics_h_scoped);
  return bVar1;
LAB_0010581a:
  bVar1 = WriteEntry(this_01,(FILE *)__stream,(LogEntry *)p_Var5[3]._M_nxt);
  if (!bVar1) goto code_r0x0010582a;
  goto LAB_001057ef;
code_r0x0010582a:
  piVar3 = __errno_location();
  strerror(*piVar3);
  std::__cxx11::string::assign((char *)err);
  fclose(__stream);
LAB_001058de:
  bVar1 = false;
LAB_001058e0:
  std::_Vector_base<StringPiece,_std::allocator<StringPiece>_>::~_Vector_base
            (&dead_outputs.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>);
  goto LAB_0010590f;
}

Assistant:

bool BuildLog::Recompact(const string& path, const BuildLogUser& user,
                         string* err) {
  METRIC_RECORD(".ninja_log recompact");

  Close();
  string temp_path = path + ".recompact";
  FILE* f = fopen(temp_path.c_str(), "wb");
  if (!f) {
    *err = strerror(errno);
    return false;
  }

  if (fprintf(f, kFileSignature, kCurrentVersion) < 0) {
    *err = strerror(errno);
    fclose(f);
    return false;
  }

  vector<StringPiece> dead_outputs;
  for (Entries::iterator i = entries_.begin(); i != entries_.end(); ++i) {
    if (user.IsPathDead(i->first)) {
      dead_outputs.push_back(i->first);
      continue;
    }

    if (!WriteEntry(f, *i->second)) {
      *err = strerror(errno);
      fclose(f);
      return false;
    }
  }

  for (size_t i = 0; i < dead_outputs.size(); ++i)
    entries_.erase(dead_outputs[i]);

  fclose(f);
  if (unlink(path.c_str()) < 0) {
    *err = strerror(errno);
    return false;
  }

  if (rename(temp_path.c_str(), path.c_str()) < 0) {
    *err = strerror(errno);
    return false;
  }

  return true;
}